

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CosineSeriesBendType.hpp
# Opt level: O3

void __thiscall
OpenMD::CosineSeriesBendType::calcForce
          (CosineSeriesBendType *this,RealType theta,RealType *V,RealType *dVdtheta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_38;
  
  dVar2 = cos(theta);
  dVar3 = sin(theta);
  *V = (((dVar2 + dVar2) * dVar2 + -1.0) * this->c2_ + this->c1_ * dVar2 + this->c0_) * this->k_;
  local_38 = -this->k_;
  dVar2 = this->c2_;
  dVar1 = this->c1_;
  dVar4 = sin(theta + theta);
  *dVdtheta = (dVar4 * (dVar2 + dVar2) + dVar3 * dVar1) * local_38;
  return;
}

Assistant:

void calcForce(RealType theta, RealType& V, RealType& dVdtheta) {
      RealType ct = cos(theta);
      RealType st = sin(theta);

      // use cos 2t = (2 cos^2 - 1)
      V        = k_ * (c0_ + c1_ * ct + c2_ * (2.0 * ct * ct - 1.0));
      dVdtheta = -k_ * (c1_ * st + 2.0 * c2_ * sin(2.0 * theta));
    }